

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  ImU32 IVar1;
  float x2;
  ImVec2 IVar2;
  size_t sVar3;
  char *in_RDX;
  ImDrawListSharedData *in_RDI;
  uint *in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  ImRect *this_00;
  ImRect *str;
  ImGuiWindow *this_01;
  ImDrawList *this_02;
  float local_94;
  float in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uStack_88;
  undefined8 local_84;
  ImVec2 IStack_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c [2];
  char *local_18;
  
  local_18 = in_RDX;
  ImGuiWindowClass::ImGuiWindowClass((ImGuiWindowClass *)&in_RDI->CurveTessellationTol);
  ImVec2::ImVec2(in_RDI->CircleVtx12 + 1);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->CircleVtx12[2].y);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->CircleVtx12[3].y);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->CircleVtx12[4].y);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->CircleVtx12[5].y);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->CircleVtx12[6].y);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->CircleVtx12[7].y);
  ImVec2::ImVec2(in_RDI->CircleVtx12 + 0xb);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->field_0x8c);
  ImVec2::ImVec2((ImVec2 *)&in_RDI[1].TexUvWhitePixel.y);
  ImVec2::ImVec2((ImVec2 *)((long)&in_RDI[1].Font + 4));
  ImVec2::ImVec2((ImVec2 *)&in_RDI[1].CurveTessellationTol);
  ImVec2::ImVec2(in_RDI[1].CircleVtx12 + 5);
  ImVec2::ImVec2(in_RDI[1].CircleVtx12 + 6);
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)&in_RDI[1].CircleVtx12[7].y);
  this_02 = (ImDrawList *)&in_RDI[1].CircleVtx12[9].y;
  ImGuiWindowTempData::ImGuiWindowTempData
            ((ImGuiWindowTempData *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  ImVec2ih::ImVec2ih((ImVec2ih *)&in_RDI[4].CircleVtx12[3].y);
  ImVec2ih::ImVec2ih((ImVec2ih *)(in_RDI[4].CircleVtx12 + 4));
  ImGuiMenuColumns::ImGuiMenuColumns
            ((ImGuiMenuColumns *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  ImGuiStorage::ImGuiStorage((ImGuiStorage *)0x1a5eed);
  ImVector<ImGuiColumns>::ImVector((ImVector<ImGuiColumns> *)&in_RDI[5].Font);
  ImDrawList::ImDrawList(this_02,in_RDI);
  str = (ImRect *)&in_RDI[7].FontSize;
  this_01 = (ImGuiWindow *)&in_RDI[6].CircleVtx12[10].y;
  do {
    this_00 = (ImRect *)this_01;
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    this_01 = (ImGuiWindow *)(this_00 + 1);
  } while (this_01 != (ImGuiWindow *)str);
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  IVar2 = (ImVec2)ImStrdup((char *)this_00);
  in_RDI->TexUvWhitePixel = IVar2;
  IVar1 = ImHashStr(local_18,0,0);
  *(ImU32 *)&in_RDI->Font = IVar1;
  ImVector<unsigned_int>::push_back
            ((ImVector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
             ,in_stack_ffffffffffffff08);
  in_RDI->FontSize = 0.0;
  *(undefined4 *)((long)&in_RDI->Font + 4) = 0;
  in_RDI->InitialFlags = 0;
  in_RDI->CircleVtx12[0].x = 0.0;
  in_RDI->CircleVtx12[0].y = 0.0;
  in_RDI->CircleVtx12[2].x = -NAN;
  ImVec2::ImVec2(local_2c,3.4028235e+38,3.4028235e+38);
  in_RDI->CircleVtx12[1] = local_2c[0];
  ImVec2::ImVec2(&local_34,0.0,0.0);
  *(ImVec2 *)&in_RDI->CircleVtx12[2].y = local_34;
  ImVec2::ImVec2(&local_3c,0.0,0.0);
  *(ImVec2 *)&in_RDI->CircleVtx12[4].y = local_3c;
  *(undefined8 *)&in_RDI->CircleVtx12[3].y = *(undefined8 *)&in_RDI->CircleVtx12[4].y;
  ImVec2::ImVec2(&local_44,0.0,0.0);
  *(ImVec2 *)&in_RDI->CircleVtx12[6].y = local_44;
  *(undefined8 *)&in_RDI->CircleVtx12[5].y = *(undefined8 *)&in_RDI->CircleVtx12[6].y;
  ImVec2::ImVec2(&local_4c,0.0,0.0);
  *(ImVec2 *)&in_RDI->CircleVtx12[7].y = local_4c;
  in_RDI->CircleVtx12[8].y = 0.0;
  in_RDI->CircleVtx12[9].x = 0.0;
  sVar3 = strlen(local_18);
  in_RDI->CircleVtx12[9].y = (float)((int)sVar3 + 1);
  x2 = (float)GetID(this_01,(char *)str,(char *)this_00);
  in_RDI->CircleVtx12[10].x = x2;
  in_RDI->CircleVtx12[10].y = 0.0;
  ImVec2::ImVec2(&local_54,0.0,0.0);
  in_RDI->CircleVtx12[0xb] = local_54;
  ImVec2::ImVec2(&local_5c,3.4028235e+38,3.4028235e+38);
  *(ImVec2 *)&in_RDI[1].TexUvWhitePixel.y = local_5c;
  ImVec2::ImVec2(&local_64,0.5,0.5);
  *(ImVec2 *)((long)&in_RDI[1].Font + 4) = local_64;
  ImVec2::ImVec2(&local_6c,0.0,0.0);
  in_RDI[1].CurveTessellationTol = local_6c.x;
  in_RDI[1].ClipRectFullscreen.x = local_6c.y;
  *(undefined1 *)((long)&in_RDI[1].ClipRectFullscreen.y + 1) = 0;
  *(undefined1 *)&in_RDI[1].ClipRectFullscreen.y = 0;
  *(undefined1 *)((long)&in_RDI[1].ClipRectFullscreen.y + 2) = 0;
  *(undefined1 *)&in_RDI[1].ClipRectFullscreen.z = 0;
  *(undefined1 *)((long)&in_RDI[1].ClipRectFullscreen.y + 3) = 0;
  *(undefined1 *)((long)&in_RDI[1].ClipRectFullscreen.z + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1].ClipRectFullscreen.z + 2) = 0;
  *(undefined1 *)((long)&in_RDI[1].ClipRectFullscreen.z + 3) = 0;
  *(undefined1 *)&in_RDI[1].ClipRectFullscreen.w = 0;
  *(undefined1 *)((long)&in_RDI[1].ClipRectFullscreen.w + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1].ClipRectFullscreen.w + 2) = 0;
  *(undefined1 *)((long)&in_RDI[1].ClipRectFullscreen.w + 3) = 0;
  *(undefined1 *)&in_RDI[1].InitialFlags = 0;
  *(undefined1 *)((long)&in_RDI[1].InitialFlags + 1) = 0xff;
  *(undefined2 *)((long)&in_RDI[1].InitialFlags + 2) = 0;
  *(undefined2 *)&in_RDI[1].CircleVtx12[0].x = 0xffff;
  *(undefined2 *)((long)&in_RDI[1].CircleVtx12[0].x + 2) = 0xffff;
  in_RDI[1].CircleVtx12[0].y = 0.0;
  *(undefined1 *)((long)&in_RDI[1].CircleVtx12[1].x + 1) = 0xff;
  *(undefined1 *)&in_RDI[1].CircleVtx12[1].x = 0xff;
  *(undefined1 *)((long)&in_RDI[1].CircleVtx12[1].x + 2) = 0;
  *(undefined1 *)((long)&in_RDI[1].CircleVtx12[1].x + 3) = 0;
  in_RDI[1].CircleVtx12[1].y = -NAN;
  in_RDI[1].CircleVtx12[2].y = 0.0;
  in_RDI[1].CircleVtx12[2].x = 0.0;
  in_RDI[1].CircleVtx12[4].y = 2.10195e-44;
  in_RDI[1].CircleVtx12[4].x = 2.10195e-44;
  in_RDI[1].CircleVtx12[3].y = 2.10195e-44;
  in_RDI[1].CircleVtx12[3].x = 2.10195e-44;
  ImVec2::ImVec2(&local_74,3.4028235e+38,3.4028235e+38);
  in_RDI[1].CircleVtx12[6] = local_74;
  in_RDI[1].CircleVtx12[5] = in_RDI[1].CircleVtx12[6];
  ImRect::ImRect(this_00,IVar2.y,IVar2.x,x2,in_stack_ffffffffffffff10);
  *(undefined8 *)&in_RDI[3].CircleVtx12[0xb].y = local_84;
  in_RDI[4].TexUvWhitePixel = IStack_7c;
  in_RDI[4].CircleVtx12[4].y = -NAN;
  in_RDI[4].CircleVtx12[5].x = -NAN;
  in_RDI[4].CircleVtx12[5].y = -1.0;
  in_RDI[4].CircleVtx12[6].x = 0.0;
  in_RDI[5].ClipRectFullscreen.y = 1.0;
  in_RDI[5].ClipRectFullscreen.x = 1.0;
  in_RDI[5].ClipRectFullscreen.z = -NAN;
  *(float **)&in_RDI[5].InitialFlags = &in_RDI[5].CircleVtx12[0].y;
  *(ImVec2 *)(*(long *)&in_RDI[5].InitialFlags + 0x40) = in_RDI->TexUvWhitePixel;
  *(undefined8 *)&in_RDI[6].CircleVtx12[3].y = 0;
  *(undefined8 *)&in_RDI[6].CircleVtx12[4].y = 0;
  *(undefined8 *)&in_RDI[6].CircleVtx12[5].y = 0;
  *(undefined8 *)&in_RDI[6].CircleVtx12[6].y = 0;
  *(undefined8 *)&in_RDI[6].CircleVtx12[7].y = 0;
  in_RDI[6].CircleVtx12[10].x = 0.0;
  in_RDI[6].CircleVtx12[9].y = 0.0;
  ImRect::ImRect((ImRect *)CONCAT44(x2,in_stack_ffffffffffffff10));
  IVar2.y = in_stack_ffffffffffffff70;
  IVar2.x = local_94;
  in_RDI[7].TexUvWhitePixel = IVar2;
  in_RDI[7].Font = (ImFont *)CONCAT44(uStack_88,in_stack_ffffffffffffff74);
  *(ImVec2 *)&in_RDI[6].CircleVtx12[10].y = in_RDI[7].TexUvWhitePixel;
  *(ImFont **)&in_RDI[6].CircleVtx12[0xb].y = in_RDI[7].Font;
  *(undefined8 *)&in_RDI[6].CircleVtx12[8].y = 0;
  *(undefined1 *)&in_RDI[7].FontSize = 0;
  in_RDI[7].ClipRectFullscreen.x = 0.0;
  in_RDI[7].CurveTessellationTol = 0.0;
  in_RDI[7].InitialFlags = 0;
  in_RDI[7].CircleVtx12[0].x = 0.0;
  in_RDI[7].ClipRectFullscreen.z = 0.0;
  in_RDI[7].ClipRectFullscreen.w = 0.0;
  in_RDI[7].CircleVtx12[0].y = 0.0;
  in_RDI[7].CircleVtx12[1].x = 0.0;
  *(undefined2 *)&in_RDI[7].CircleVtx12[3].y = 0xffff;
  *(byte *)((long)&in_RDI[7].CircleVtx12[3].y + 2) =
       *(byte *)((long)&in_RDI[7].CircleVtx12[3].y + 2) & 0xfb;
  *(byte *)((long)&in_RDI[7].CircleVtx12[3].y + 2) =
       *(byte *)((long)&in_RDI[7].CircleVtx12[3].y + 2) & 0xfd;
  *(byte *)((long)&in_RDI[7].CircleVtx12[3].y + 2) =
       *(byte *)((long)&in_RDI[7].CircleVtx12[3].y + 2) & 0xfe;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name)
    : DrawListInst(&context->DrawListSharedData)
{
    Name = ImStrdup(name);
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    Flags = FlagsPreviousFrame = ImGuiWindowFlags_None;
    Viewport = NULL;
    ViewportId = 0;
    ViewportAllowPlatformMonitorExtend = -1;
    ViewportPos = ImVec2(FLT_MAX, FLT_MAX);
    Pos = ImVec2(0.0f, 0.0f);
    Size = SizeFull = ImVec2(0.0f, 0.0f);
    ContentSize = ContentSizeExplicit = ImVec2(0.0f, 0.0f);
    WindowPadding = ImVec2(0.0f, 0.0f);
    WindowRounding = 0.0f;
    WindowBorderSize = 0.0f;
    NameBufLen = (int)strlen(name) + 1;
    MoveId = GetID("#MOVE");
    ChildId = 0;
    Scroll = ImVec2(0.0f, 0.0f);
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    ScrollbarSizes = ImVec2(0.0f, 0.0f);
    ScrollbarX = ScrollbarY = false;
    ViewportOwned = false;
    Active = WasActive = false;
    WriteAccessed = false;
    Collapsed = false;
    WantCollapseToggle = false;
    SkipItems = false;
    Appearing = false;
    Hidden = false;
    IsFallbackWindow = false;
    HasCloseButton = false;
    ResizeBorderHeld = -1;
    BeginCount = 0;
    BeginOrderWithinParent = -1;
    BeginOrderWithinContext = -1;
    PopupId = 0;
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoFitChildAxises = 0x00;
    AutoFitOnlyGrows = false;
    AutoPosLastDirection = ImGuiDir_None;
    HiddenFramesCanSkipItems = HiddenFramesCannotSkipItems = 0;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = SetWindowDockAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);

    InnerRect = ImRect(0.0f, 0.0f, 0.0f, 0.0f); // Clear so the InnerRect.GetSize() code in Begin() doesn't lead to overflow even if the result isn't used.

    LastFrameActive = -1;
    LastFrameJustFocused = -1;
    LastTimeActive = -1.0f;
    ItemWidthDefault = 0.0f;
    FontWindowScale = FontDpiScale = 1.0f;
    SettingsOffset = -1;

    DrawList = &DrawListInst;
    DrawList->_OwnerName = Name;
    ParentWindow = NULL;
    RootWindow = NULL;
    RootWindowDockStop = NULL;
    RootWindowForTitleBarHighlight = NULL;
    RootWindowForNav = NULL;

    NavLastIds[0] = NavLastIds[1] = 0;
    NavRectRel[0] = NavRectRel[1] = ImRect();
    NavLastChildNavWindow = NULL;

    MemoryCompacted = false;
    MemoryDrawListIdxCapacity = MemoryDrawListVtxCapacity = 0;

    DockNode = DockNodeAsHost = NULL;
    DockId = 0;
    DockTabItemStatusFlags = ImGuiItemStatusFlags_None;
    DockOrder = -1;
    DockIsActive = DockTabIsVisible = DockTabWantClose = false;
}